

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFilledPolygon(gdImagePtr im,gdPointPtr p,int n,int c)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  gdPointPtr pgVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  gdPointPtr pgVar13;
  int iVar14;
  gdPointPtr pgVar15;
  int iVar16;
  int local_44;
  int local_40;
  
  if (n < 1) {
    return;
  }
  local_40 = c;
  if (c == -7) {
    local_40 = im->AA_color;
  }
  uVar7 = (ulong)(uint)n;
  iVar2 = im->polyAllocated;
  if (iVar2 == 0) {
    iVar2 = overflow2(4,n);
    if (iVar2 != 0) {
      return;
    }
    piVar3 = (int *)gdMalloc(uVar7 * 4);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
    im->polyAllocated = n;
  }
  else if (iVar2 < n) {
    while (iVar2 < n) {
      iVar2 = iVar2 * 2;
      im->polyAllocated = iVar2;
    }
    iVar2 = overflow2(4,iVar2);
    if (iVar2 != 0) {
      return;
    }
    piVar3 = (int *)gdReallocEx(im->polyInts,(long)im->polyAllocated << 2);
    im->polyInts = piVar3;
    if (piVar3 == (int *)0x0) {
      return;
    }
  }
  iVar2 = p->y;
  local_44 = iVar2;
  for (uVar6 = 1; uVar6 < uVar7; uVar6 = uVar6 + 1) {
    iVar16 = p[uVar6].y;
    if (iVar16 < iVar2) {
      iVar2 = iVar16;
    }
    if (local_44 < iVar16) {
      local_44 = iVar16;
    }
  }
  iVar16 = im->cy1;
  if (im->cy1 < iVar2) {
    iVar16 = iVar2;
  }
  iVar2 = im->cy2;
  if (local_44 < im->cy2) {
    iVar2 = local_44;
  }
  do {
    if (iVar2 < iVar16) {
      if (c != -7) {
        return;
      }
      gdImagePolygon(im,p,n,-7);
      return;
    }
    iVar5 = 0;
    pgVar8 = p;
    for (uVar6 = 0; lVar4 = (long)iVar5, uVar7 != uVar6; uVar6 = uVar6 + 1) {
      uVar10 = uVar6 & 0xffffffff;
      if (uVar6 == 0) {
        uVar10 = (ulong)(uint)n;
      }
      pgVar15 = p + (uVar10 - 1);
      iVar14 = p[uVar10 - 1].y;
      iVar11 = pgVar8->y;
      pgVar13 = pgVar8;
      iVar9 = iVar11;
      if ((iVar14 < iVar11) ||
         (bVar1 = iVar11 < iVar14, pgVar13 = pgVar15, pgVar15 = pgVar8, iVar9 = iVar14,
         iVar14 = iVar11, bVar1)) {
        iVar11 = pgVar13->x;
        if ((iVar16 < iVar14) || (iVar9 <= iVar16)) {
          if ((iVar16 != local_44) || (iVar16 != iVar9)) goto LAB_0010ed4c;
        }
        else {
          iVar11 = (int)((float)pgVar15->x +
                        (float)((iVar11 - pgVar15->x) * (iVar16 - iVar14)) / (float)(iVar9 - iVar14)
                        + 0.5);
        }
        iVar5 = iVar5 + 1;
        im->polyInts[lVar4] = iVar11;
      }
LAB_0010ed4c:
      pgVar8 = pgVar8 + 1;
    }
    for (uVar6 = 1; (long)uVar6 < lVar4; uVar6 = uVar6 + 1) {
      piVar3 = im->polyInts;
      iVar14 = piVar3[uVar6];
      uVar10 = uVar6 & 0xffffffff;
      while (uVar12 = (uint)uVar10, 0 < (int)uVar12) {
        if (piVar3[uVar10 - 1] <= iVar14) goto LAB_0010ed8b;
        piVar3[uVar10] = piVar3[uVar10 - 1];
        uVar10 = (ulong)(uVar12 - 1);
      }
      uVar12 = 0;
LAB_0010ed8b:
      piVar3[uVar12] = iVar14;
    }
    for (lVar4 = 0; lVar4 < iVar5 + -1; lVar4 = lVar4 + 2) {
      gdImageLine(im,im->polyInts[lVar4],iVar16,im->polyInts[lVar4 + 1],iVar16,local_40);
    }
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

BGD_DECLARE(void) gdImageFilledPolygon (gdImagePtr im, gdPointPtr p, int n, int c)
{
	int i;
	int j;
	int index;
	int y;
	int miny, maxy, pmaxy;
	int x1, y1;
	int x2, y2;
	int ind1, ind2;
	int ints;
	int fill_color;
	if (n <= 0) {
		return;
	}

	if (c == gdAntiAliased) {
		fill_color = im->AA_color;
	} else {
		fill_color = c;
	}
	if (!im->polyAllocated) {
		if (overflow2(sizeof (int), n)) {
			return;
		}
		im->polyInts = (int *) gdMalloc (sizeof (int) * n);
		if (!im->polyInts) {
			return;
		}
		im->polyAllocated = n;
	}
	if (im->polyAllocated < n) {
		while (im->polyAllocated < n) {
			im->polyAllocated *= 2;
		}
		if (overflow2(sizeof (int), im->polyAllocated)) {
			return;
		}
		im->polyInts = (int *) gdReallocEx (im->polyInts,
						    sizeof (int) * im->polyAllocated);
		if (!im->polyInts) {
			return;
		}
	}
	miny = p[0].y;
	maxy = p[0].y;
	for (i = 1; (i < n); i++) {
		if (p[i].y < miny) {
			miny = p[i].y;
		}
		if (p[i].y > maxy) {
			maxy = p[i].y;
		}
	}
	pmaxy = maxy;
	/* 2.0.16: Optimization by Ilia Chipitsine -- don't waste time offscreen */
	/* 2.0.26: clipping rectangle is even better */
	if (miny < im->cy1) {
		miny = im->cy1;
	}
	if (maxy > im->cy2) {
		maxy = im->cy2;
	}
	/* Fix in 1.3: count a vertex only once */
	for (y = miny; (y <= maxy); y++) {
		ints = 0;
		for (i = 0; (i < n); i++) {
			if (!i) {
				ind1 = n - 1;
				ind2 = 0;
			} else {
				ind1 = i - 1;
				ind2 = i;
			}
			y1 = p[ind1].y;
			y2 = p[ind2].y;
			if (y1 < y2) {
				x1 = p[ind1].x;
				x2 = p[ind2].x;
			} else if (y1 > y2) {
				y2 = p[ind1].y;
				y1 = p[ind2].y;
				x2 = p[ind1].x;
				x1 = p[ind2].x;
			} else {
				continue;
			}

			/* Do the following math as float intermediately, and round to ensure
			 * that Polygon and FilledPolygon for the same set of points have the
			 * same footprint. */

			if ((y >= y1) && (y < y2)) {
				im->polyInts[ints++] = (int) ((float) ((y - y1) * (x2 - x1)) /
				                              (float) (y2 - y1) + 0.5 + x1);
			} else if ((y == pmaxy) && (y == y2)) {
				im->polyInts[ints++] = x2;
			}
		}
		/*
		  2.0.26: polygons pretty much always have less than 100 points,
		  and most of the time they have considerably less. For such trivial
		  cases, insertion sort is a good choice. Also a good choice for
		  future implementations that may wish to indirect through a table.
		*/
		for (i = 1; (i < ints); i++) {
			index = im->polyInts[i];
			j = i;
			while ((j > 0) && (im->polyInts[j - 1] > index)) {
				im->polyInts[j] = im->polyInts[j - 1];
				j--;
			}
			im->polyInts[j] = index;
		}
		for (i = 0; (i < (ints-1)); i += 2) {
			/* 2.0.29: back to gdImageLine to prevent segfaults when
			  performing a pattern fill */
			gdImageLine (im, im->polyInts[i], y, im->polyInts[i + 1], y,
			             fill_color);
		}
	}
	/* If we are drawing this AA, then redraw the border with AA lines. */
	/* This doesn't work as well as I'd like, but it doesn't clash either. */
	if (c == gdAntiAliased) {
		gdImagePolygon (im, p, n, c);
	}
}